

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  lha *lha_00;
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  mode_t mVar6;
  wchar_t *local_e0;
  wchar_t *conv_buffer_p;
  archive_mstring conv_buffer;
  wchar_t err;
  char *signature;
  uchar *p;
  lha *lha;
  archive_wstring pathname;
  archive_wstring linkname;
  archive_entry *entry_local;
  archive_read *a_local;
  
  lha_crc16_init();
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha_00 = (lha *)a->format->data;
  lha_00->decompress_init = '\0';
  lha_00->end_of_entry = '\0';
  lha_00->end_of_entry_cleanup = '\0';
  lha_00->entry_unconsumed = 0;
  signature = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (signature == (char *)0x0) {
    pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      wVar1 = truncated_error(a);
      return wVar1;
    }
    return L'\x01';
  }
  if (((lha_00->found_first_header == '\0') && (*signature == 'M')) && (signature[1] == 'Z')) {
    conv_buffer._100_4_ = lha_skip_sfx(a);
    if ((int)conv_buffer._100_4_ < L'\xffffffec') {
      return conv_buffer._100_4_;
    }
    signature = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (signature == (char *)0x0) {
      wVar1 = truncated_error(a);
      return wVar1;
    }
  }
  if (*signature == '\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    sVar5 = lha_check_header_format(signature);
    if (sVar5 == 0) {
      lha_00->found_first_header = '\x01';
      lha_00->header_size = 0;
      lha_00->level = signature[0x14];
      lha_00->method[0] = signature[3];
      lha_00->method[1] = signature[4];
      lha_00->method[2] = signature[5];
      iVar2 = memcmp(lha_00->method,"lhd",3);
      if (iVar2 == 0) {
        lha_00->directory = '\x01';
      }
      else {
        lha_00->directory = '\0';
      }
      iVar2 = memcmp(lha_00->method,"lh0",3);
      if ((iVar2 == 0) || (iVar2 = memcmp(lha_00->method,"lz4",3), iVar2 == 0)) {
        lha_00->entry_is_compressed = '\0';
      }
      else {
        lha_00->entry_is_compressed = '\x01';
      }
      lha_00->compsize = 0;
      lha_00->origsize = 0;
      lha_00->setflag = 0;
      lha_00->birthtime = 0;
      lha_00->birthtime_tv_nsec = 0;
      lha_00->mtime = 0;
      lha_00->mtime_tv_nsec = 0;
      lha_00->atime = 0;
      lha_00->atime_tv_nsec = 0;
      mVar6 = 0x1b6;
      if (lha_00->directory != '\0') {
        mVar6 = 0x1ff;
      }
      lha_00->mode = mVar6;
      lha_00->uid = 0;
      lha_00->gid = 0;
      (lha_00->dirname).length = 0;
      (lha_00->filename).length = 0;
      lha_00->dos_attr = '\0';
      if (lha_00->opt_sconv == (archive_string_conv *)0x0) {
        lha_00->sconv_dir = (archive_string_conv *)0x0;
        lha_00->sconv_fname = (archive_string_conv *)0x0;
      }
      else {
        lha_00->sconv_dir = lha_00->opt_sconv;
        lha_00->sconv_fname = lha_00->opt_sconv;
      }
      switch(signature[0x14]) {
      case '\0':
        conv_buffer._100_4_ = lha_read_file_header_0(a,lha_00);
        break;
      case '\x01':
        conv_buffer._100_4_ = lha_read_file_header_1(a,lha_00);
        break;
      case '\x02':
        conv_buffer._100_4_ = lha_read_file_header_2(a,lha_00);
        break;
      case '\x03':
        conv_buffer._100_4_ = lha_read_file_header_3(a,lha_00);
        break;
      default:
        archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d",
                          (ulong)(byte)signature[0x14]);
        conv_buffer._100_4_ = 0xffffffe2;
      }
      if ((int)conv_buffer._100_4_ < -0x14) {
        a_local._4_4_ = conv_buffer._100_4_;
      }
      else if ((lha_00->directory == '\0') && ((lha_00->filename).length == 0)) {
        a_local._4_4_ = truncated_error(a);
      }
      else {
        lha = (lha *)0x0;
        pathname.s = (wchar_t *)0x0;
        pathname.length = 0;
        pathname.buffer_length = 0;
        conv_buffer_p = (wchar_t *)0x0;
        conv_buffer.aes_mbs.s = (char *)0x0;
        conv_buffer.aes_mbs.length = 0;
        conv_buffer.aes_wcs.buffer_length = 0;
        conv_buffer.aes_mbs_in_locale.s = (char *)0x0;
        conv_buffer.aes_mbs_in_locale.length = 0;
        conv_buffer.aes_mbs.buffer_length = 0;
        conv_buffer.aes_utf8.s = (char *)0x0;
        conv_buffer.aes_utf8.length = 0;
        conv_buffer.aes_utf8.buffer_length = 0;
        conv_buffer.aes_wcs.s = (wchar_t *)0x0;
        conv_buffer.aes_wcs.length = 0;
        wVar1 = archive_mstring_copy_mbs_len_l
                          ((archive_mstring *)&conv_buffer_p,(lha_00->dirname).s,
                           (lha_00->dirname).length,lha_00->sconv_dir);
        if (wVar1 == L'\0') {
          wVar1 = archive_mstring_get_wcs
                            ((archive_conflict *)a,(archive_mstring *)&conv_buffer_p,&local_e0);
          if (wVar1 != L'\0') {
            conv_buffer._100_4_ = 0xffffffe2;
          }
        }
        else {
          pcVar4 = archive_string_conversion_charset_name(lha_00->sconv_dir);
          archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",
                            pcVar4);
          conv_buffer._100_4_ = 0xffffffe2;
        }
        if (conv_buffer._100_4_ == -0x1e) {
          archive_mstring_clean((archive_mstring *)&conv_buffer_p);
          archive_wstring_free((archive_wstring *)&lha);
          archive_wstring_free((archive_wstring *)&pathname.buffer_length);
          a_local._4_4_ = conv_buffer._100_4_;
        }
        else {
          pathname.s = (wchar_t *)0x0;
          archive_wstring_concat
                    ((archive_wstring *)&lha,(archive_wstring *)&conv_buffer.aes_utf8.buffer_length)
          ;
          conv_buffer.aes_mbs.s = (char *)0x0;
          conv_buffer.aes_mbs_in_locale.s = (char *)0x0;
          conv_buffer.aes_utf8.s = (char *)0x0;
          conv_buffer.aes_wcs.s = (wchar_t *)0x0;
          wVar1 = archive_mstring_copy_mbs_len_l
                            ((archive_mstring *)&conv_buffer_p,(lha_00->filename).s,
                             (lha_00->filename).length,lha_00->sconv_fname);
          if (wVar1 == L'\0') {
            wVar1 = archive_mstring_get_wcs
                              ((archive_conflict *)a,(archive_mstring *)&conv_buffer_p,&local_e0);
            if (wVar1 != L'\0') {
              conv_buffer._100_4_ = 0xffffffe2;
            }
          }
          else {
            pcVar4 = archive_string_conversion_charset_name(lha_00->sconv_fname);
            archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",
                              pcVar4);
            conv_buffer._100_4_ = 0xffffffe2;
          }
          if (conv_buffer._100_4_ == -0x1e) {
            archive_mstring_clean((archive_mstring *)&conv_buffer_p);
            archive_wstring_free((archive_wstring *)&lha);
            archive_wstring_free((archive_wstring *)&pathname.buffer_length);
            a_local._4_4_ = conv_buffer._100_4_;
          }
          else {
            archive_wstring_concat
                      ((archive_wstring *)&lha,
                       (archive_wstring *)&conv_buffer.aes_utf8.buffer_length);
            archive_mstring_clean((archive_mstring *)&conv_buffer_p);
            if ((lha_00->mode & 0xf000) == 0xa000) {
              wVar1 = lha_parse_linkname((archive_wstring *)&pathname.buffer_length,
                                         (archive_wstring *)&lha);
              if (wVar1 == L'\0') {
                archive_set_error(&a->archive,0x54,"Unknown symlink-name");
                archive_wstring_free((archive_wstring *)&lha);
                archive_wstring_free((archive_wstring *)&pathname.buffer_length);
                return L'\xffffffe7';
              }
            }
            else {
              uVar3 = 0x8000;
              if (lha_00->directory != '\0') {
                uVar3 = 0x4000;
              }
              lha_00->mode = lha_00->mode & 0xffff0fff | uVar3;
            }
            if (((lha_00->setflag & 4U) == 0) && ((lha_00->dos_attr & 1) != 0)) {
              lha_00->mode = lha_00->mode & 0xffffff6d;
            }
            archive_entry_copy_pathname_w(entry,(wchar_t *)lha);
            archive_wstring_free((archive_wstring *)&lha);
            archive_entry_set_symlink(entry,(char *)0x0);
            archive_wstring_free((archive_wstring *)&pathname.buffer_length);
            if (signature[0x14] == '\0') {
              lha_replace_path_separator(lha_00,entry);
            }
            archive_entry_set_mode(entry,lha_00->mode);
            archive_entry_set_uid(entry,lha_00->uid);
            archive_entry_set_gid(entry,lha_00->gid);
            if ((lha_00->uname).length != 0) {
              archive_entry_set_uname(entry,(lha_00->uname).s);
            }
            if ((lha_00->gname).length != 0) {
              archive_entry_set_gname(entry,(lha_00->gname).s);
            }
            if ((lha_00->setflag & 1U) == 0) {
              archive_entry_unset_birthtime(entry);
              archive_entry_unset_ctime(entry);
            }
            else {
              archive_entry_set_birthtime(entry,lha_00->birthtime,(ulong)lha_00->birthtime_tv_nsec);
              archive_entry_set_ctime(entry,lha_00->birthtime,(ulong)lha_00->birthtime_tv_nsec);
            }
            archive_entry_set_mtime(entry,lha_00->mtime,(ulong)lha_00->mtime_tv_nsec);
            if ((lha_00->setflag & 2U) == 0) {
              archive_entry_unset_atime(entry);
            }
            else {
              archive_entry_set_atime(entry,lha_00->atime,(ulong)lha_00->atime_tv_nsec);
            }
            if ((lha_00->directory == '\0') &&
               (pcVar4 = archive_entry_symlink(entry), pcVar4 == (char *)0x0)) {
              archive_entry_set_size(entry,lha_00->origsize);
            }
            else {
              archive_entry_unset_size(entry);
            }
            lha_00->entry_bytes_remaining = lha_00->compsize;
            if (lha_00->entry_bytes_remaining < 0) {
              archive_set_error(&a->archive,0x54,"Invalid LHa entry size");
              a_local._4_4_ = L'\xffffffe2';
            }
            else {
              lha_00->entry_offset = 0;
              lha_00->entry_crc_calculated = 0;
              if ((lha_00->directory != '\0') || (lha_00->compsize == 0)) {
                lha_00->end_of_entry = '\x01';
              }
              snprintf(lha_00->format_name,0x40,"lha -%c%c%c-",(ulong)(uint)(int)lha_00->method[0],
                       (ulong)(uint)(int)lha_00->method[1],(ulong)(uint)(int)lha_00->method[2]);
              (a->archive).archive_format_name = lha_00->format_name;
              a_local._4_4_ = conv_buffer._100_4_;
            }
          }
        }
      }
    }
    else {
      archive_set_error(&a->archive,0x54,"Bad LHa file");
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_wstring linkname;
	struct archive_wstring pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	struct archive_mstring conv_buffer;
	const wchar_t *conv_buffer_p;

	lha_crc16_init();

	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL) {
		lha->sconv_dir = lha->opt_sconv;
		lha->sconv_fname = lha->opt_sconv;
	} else {
		lha->sconv_dir = NULL;
		lha->sconv_fname = NULL;
	}

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename, after converting to Unicode.
	 * This is because codepages might differ between dirname and filename.
	*/
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_init(&conv_buffer.aes_mbs);
	archive_string_init(&conv_buffer.aes_mbs_in_locale);
	archive_string_init(&conv_buffer.aes_utf8);
	archive_string_init(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->dirname.s, lha->dirname.length, lha->sconv_dir)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_dir));
		err = ARCHIVE_FATAL;
	} else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_copy(&pathname, &conv_buffer.aes_wcs);

	archive_string_empty(&conv_buffer.aes_mbs);
	archive_string_empty(&conv_buffer.aes_mbs_in_locale);
	archive_string_empty(&conv_buffer.aes_utf8);
	archive_wstring_empty(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->filename.s, lha->filename.length, lha->sconv_fname)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_fname));
		err = ARCHIVE_FATAL;
	}
	else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_concat(&pathname, &conv_buffer.aes_wcs);
	archive_mstring_clean(&conv_buffer);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_wstring_free(&pathname);
			archive_wstring_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	archive_entry_copy_pathname_w(entry, pathname.s);
	archive_wstring_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		archive_entry_copy_symlink_w(entry, linkname.s);
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_wstring_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	if (lha->entry_bytes_remaining < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa entry size");
		return (ARCHIVE_FATAL);
	}
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	snprintf(lha->format_name, sizeof(lha->format_name), "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}